

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockFailureTest.cpp
# Opt level: O3

void __thiscall
TEST_MockFailureTest_MockUnexpectedOutputParameterFailure_Test::testBody
          (TEST_MockFailureTest_MockUnexpectedOutputParameterFailure_Test *this)

{
  MockCheckedExpectedCall *pMVar1;
  MockExpectedCallsList *pMVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UtestShell *pUVar4;
  char *pcVar5;
  TestTerminator *pTVar6;
  int out2;
  int out1;
  MockNamedValue actualParameter;
  MockUnexpectedOutputParameterFailure failure;
  undefined1 local_e8 [104];
  TestFailure local_80;
  
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call1;
  SimpleString::SimpleString((SimpleString *)&local_80,"foo");
  iVar3 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[2])(pMVar1,&local_80);
  SimpleString::SimpleString((SimpleString *)(local_e8 + 0x18),"boo");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x30))
            ((long *)CONCAT44(extraout_var,iVar3),local_e8 + 0x18,local_e8 + 0x14,4);
  SimpleString::~SimpleString((SimpleString *)(local_e8 + 0x18));
  SimpleString::~SimpleString((SimpleString *)&local_80);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call2;
  SimpleString::SimpleString((SimpleString *)&local_80,"foo");
  iVar3 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[2])(pMVar1,&local_80);
  SimpleString::SimpleString((SimpleString *)(local_e8 + 0x18),"boo");
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x30))
            ((long *)CONCAT44(extraout_var_00,iVar3),local_e8 + 0x18,local_e8 + 0x10,4);
  SimpleString::~SimpleString((SimpleString *)(local_e8 + 0x18));
  SimpleString::~SimpleString((SimpleString *)&local_80);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call3;
  SimpleString::SimpleString((SimpleString *)&local_80,"unrelated");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[2])(pMVar1,&local_80);
  SimpleString::~SimpleString((SimpleString *)&local_80);
  pMVar2 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).list;
  (*pMVar2->_vptr_MockExpectedCallsList[0xc])
            (pMVar2,(this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call1);
  pMVar2 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).list;
  (*pMVar2->_vptr_MockExpectedCallsList[0xc])
            (pMVar2,(this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call2);
  pMVar2 = (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).list;
  (*pMVar2->_vptr_MockExpectedCallsList[0xc])
            (pMVar2,(this->super_TEST_GROUP_CppUTestGroupMockFailureTest).call3);
  SimpleString::SimpleString((SimpleString *)&local_80,"bar");
  MockNamedValue::MockNamedValue((MockNamedValue *)(local_e8 + 0x18),(SimpleString *)&local_80);
  SimpleString::~SimpleString((SimpleString *)&local_80);
  MockNamedValue::setValue((MockNamedValue *)(local_e8 + 0x18),(void *)0x123);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString((SimpleString *)local_e8,"foo");
  MockUnexpectedOutputParameterFailure::MockUnexpectedOutputParameterFailure
            ((MockUnexpectedOutputParameterFailure *)&local_80,pUVar4,(SimpleString *)local_e8,
             (MockNamedValue *)(local_e8 + 0x18),
             (this->super_TEST_GROUP_CppUTestGroupMockFailureTest).list);
  SimpleString::~SimpleString((SimpleString *)local_e8);
  pUVar4 = UtestShell::getCurrent();
  TestFailure::getMessage((TestFailure *)local_e8);
  pcVar5 = SimpleString::asCharString((SimpleString *)local_e8);
  pTVar6 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[9])
            (pUVar4,
             "Mock Failure: Unexpected output parameter name to function \"foo\": bar\n\tEXPECTED calls that WERE NOT fulfilled related to function: foo\n\t\tfoo -> const void* boo: <output> (expected 1 call, called 0 times)\n\t\tfoo -> const void* boo: <output> (expected 1 call, called 0 times)\n\tEXPECTED calls that WERE fulfilled related to function: foo\n\t\t<none>\n\tACTUAL unexpected output parameter passed to function: foo\n\t\tvoid* bar"
             ,pcVar5,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockFailureTest.cpp"
             ,0xc6,pTVar6);
  SimpleString::~SimpleString((SimpleString *)local_e8);
  TestFailure::~TestFailure(&local_80);
  MockNamedValue::~MockNamedValue((MockNamedValue *)(local_e8 + 0x18));
  return;
}

Assistant:

TEST(MockFailureTest, MockUnexpectedOutputParameterFailure)
{
    int out1;
    int out2;
    call1->withName("foo").withOutputParameterReturning("boo", &out1, sizeof(out1));
    call2->withName("foo").withOutputParameterReturning("boo", &out2, sizeof(out2));
    call3->withName("unrelated");
    addThreeCallsToList();

    MockNamedValue actualParameter("bar");
    actualParameter.setValue((void *)0x123);

    MockUnexpectedOutputParameterFailure failure(UtestShell::getCurrent(), "foo", actualParameter, *list);
    STRCMP_EQUAL("Mock Failure: Unexpected output parameter name to function \"foo\": bar\n"
                 "\tEXPECTED calls that WERE NOT fulfilled related to function: foo\n"
                 "\t\tfoo -> const void* boo: <output> (expected 1 call, called 0 times)\n"
                 "\t\tfoo -> const void* boo: <output> (expected 1 call, called 0 times)\n"
                 "\tEXPECTED calls that WERE fulfilled related to function: foo\n"
                 "\t\t<none>\n"
                 "\tACTUAL unexpected output parameter passed to function: foo\n"
                 "\t\tvoid* bar", failure.getMessage().asCharString());
}